

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  _Alloc_hider _Var1;
  _Alloc_hider _Var2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  istream *piVar6;
  mapped_type *pmVar7;
  long lVar8;
  iterator iVar9;
  pointer pcVar10;
  int iVar11;
  undefined1 local_b0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mime_types;
  undefined1 auStack_78 [4];
  int types;
  string mime;
  undefined1 auStack_50 [4];
  int files;
  string type;
  
  std::istream::operator>>
            ((istream *)&std::cin,
             (int *)((long)&mime_types._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  std::istream::ignore();
  std::istream::operator>>((istream *)&std::cin,(int *)(mime.field_2._M_local_buf + 0xc));
  std::istream::ignore();
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cerr,
                      mime_types._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  plVar5 = (long *)std::ostream::operator<<(poVar4,mime.field_2._12_4_);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  mime_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&mime_types;
  mime_types._M_t._M_impl._0_4_ = 0;
  mime_types._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mime_types._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  mime_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  mime_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       mime_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (0 < mime_types._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_) {
    iVar11 = 0;
    do {
      _auStack_50 = (pointer)&type._M_string_length;
      type._M_dataplus._M_p = (pointer)0x0;
      type._M_string_length._0_1_ = 0;
      _auStack_78 = (pointer)&mime._M_string_length;
      mime._M_dataplus._M_p = (pointer)0x0;
      mime._M_string_length._0_1_ = 0;
      piVar6 = std::operator>>((istream *)&std::cin,(string *)auStack_50);
      std::operator>>(piVar6,(string *)auStack_78);
      std::istream::ignore();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"type: ",6);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,_auStack_50,(long)type._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", mime: ",8);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,_auStack_78,(long)mime._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      _Var2 = type._M_dataplus;
      _Var1._M_p = _auStack_50;
      if (type._M_dataplus._M_p != (pointer)0x0) {
        pcVar10 = (pointer)0x0;
        do {
          iVar3 = tolower((int)_Var1._M_p[(long)pcVar10]);
          _Var1._M_p[(long)pcVar10] = (char)iVar3;
          pcVar10 = pcVar10 + 1;
        } while (_Var2._M_p != pcVar10);
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_b0,(key_type *)auStack_50);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((size_type *)_auStack_78 != &mime._M_string_length) {
        operator_delete(_auStack_78,
                        CONCAT71(mime._M_string_length._1_7_,(undefined1)mime._M_string_length) + 1)
        ;
      }
      if ((size_type *)_auStack_50 != &type._M_string_length) {
        operator_delete(_auStack_50,
                        CONCAT71(type._M_string_length._1_7_,(undefined1)type._M_string_length) + 1)
        ;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < mime_types._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  }
  if (0 < (int)mime.field_2._12_4_) {
    iVar11 = 0;
    do {
      _auStack_50 = (pointer)&type._M_string_length;
      type._M_dataplus._M_p = (pointer)0x0;
      type._M_string_length._0_1_ = 0;
      std::operator>>((istream *)&std::cin,(string *)auStack_50);
      std::istream::ignore();
      _Var2 = type._M_dataplus;
      _Var1._M_p = _auStack_50;
      if (type._M_dataplus._M_p != (pointer)0x0) {
        pcVar10 = (pointer)0x0;
        do {
          iVar3 = tolower((int)_Var1._M_p[(long)pcVar10]);
          _Var1._M_p[(long)pcVar10] = (char)iVar3;
          pcVar10 = pcVar10 + 1;
        } while (_Var2._M_p != pcVar10);
      }
      lVar8 = std::__cxx11::string::rfind((char)auStack_50,0x2e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"file #",6);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,". ",2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,_auStack_50,(long)type._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; rpos = ",9);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", npos = ",9);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (lVar8 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"UNKNOWN",7);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
      }
      else {
        std::__cxx11::string::substr((ulong)auStack_78,(ulong)auStack_50);
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_b0,(key_type *)auStack_78);
        if ((_Base_ptr)&mime_types == iVar9._M_node) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"UNKNOWN",7);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
          poVar4 = (ostream *)&std::cout;
        }
        else {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,*(char **)(iVar9._M_node + 2),
                              (long)iVar9._M_node[2]._M_parent);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        }
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((size_type *)_auStack_78 != &mime._M_string_length) {
          operator_delete(_auStack_78,
                          CONCAT71(mime._M_string_length._1_7_,(undefined1)mime._M_string_length) +
                          1);
        }
      }
      if ((size_type *)_auStack_50 != &type._M_string_length) {
        operator_delete(_auStack_50,
                        CONCAT71(type._M_string_length._1_7_,(undefined1)type._M_string_length) + 1)
        ;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < (int)mime.field_2._12_4_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_b0);
  return 0;
}

Assistant:

int main()
{
	int types, files;
	cin >> types; cin.ignore();
	cin >> files; cin.ignore();
	
	std::cerr << types << ", " << files << std::endl;
	
	std::map<std::string, std::string> mime_types;
	for (int i = 0; i < types; i++)
	{
	    std::string type;
	    std::string mime;
		std::cin >> type >> mime;
		std::cin.ignore();
		
		std::cerr << "type: " << type << ", mime: " << mime << std::endl;
		std::transform(type.begin(), type.end(), type.begin(), ::tolower);
		mime_types[type] = mime;
	}
	
	for (int i = 0; i < files; i++)
	{
	    std::string filename;
	    std::cin >> filename;
	    std::cin.ignore();
	    std::transform(filename.begin(), filename.end(), filename.begin(), ::tolower);
	    size_t pos = filename.rfind('.');
	    std::cerr << "file #" << i << ". " << filename << "; rpos = " << pos << ", npos = " << std::string::npos << std::endl;
	    
	    if (std::string::npos != pos)
	    {
	        std::string ext = filename.substr(pos + 1);
	        //std::cerr << pos << ", " << ext <<  std::endl;
	        std::map<std::string, std::string>::const_iterator i = mime_types.find(ext);
	        if (mime_types.end() == i)
	        {
	            std::cout << "UNKNOWN" << std::endl;
	        } else
	        {
	            std::cout << i->second << std::endl;
	        }
	    } else
	    {
	        std::cout << "UNKNOWN" << std::endl;
	    }
	}
	
	return 0;
}